

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Fad<double> *pFVar9;
  Fad<double> *pFVar10;
  double dVar11;
  double dVar12;
  
  pFVar9 = (this->left_->fadexpr_).left_;
  pFVar10 = (this->left_->fadexpr_).right_;
  dVar1 = (pFVar9->dx_).ptr_to_data[i];
  dVar2 = (pFVar10->dx_).ptr_to_data[i];
  dVar3 = pFVar9->val_;
  dVar4 = pFVar10->val_;
  dVar11 = sin(((this->right_->fadexpr_).expr_.fadexpr_.left_)->val_ *
               ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  pFVar9 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  pFVar10 = (this->right_->fadexpr_).expr_.fadexpr_.right_;
  dVar5 = pFVar10->val_;
  dVar6 = pFVar9->val_;
  dVar7 = (pFVar10->dx_).ptr_to_data[i];
  dVar8 = (pFVar9->dx_).ptr_to_data[i];
  dVar12 = cos(dVar5 * dVar6);
  return dVar12 * (dVar8 * dVar5 + dVar7 * dVar6) *
         ((this->left_->fadexpr_).left_)->val_ * ((this->left_->fadexpr_).right_)->val_ +
         dVar11 * (dVar1 * dVar4 + dVar2 * dVar3);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}